

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O1

ssize_t __thiscall
capnp::Request<capnp::AnyPointer,_capnp::AnyPointer>::send
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *this,int __fd,void *__buf,size_t __n,
          int __flags)

{
  long *plVar1;
  undefined4 in_register_00000034;
  long lVar2;
  RemotePromise<capnp::AnyPointer> typelessPromise;
  PropagateException local_59;
  undefined8 *local_58;
  long *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  CapTableBuilder *local_28;
  Own<kj::_::PromiseNode> local_20;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  (**(code **)**(undefined8 **)(lVar2 + 0x20))(&local_58);
  plVar1 = *(long **)(lVar2 + 0x20);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)(lVar2 + 0x20) = 0;
    (**(code **)**(undefined8 **)(lVar2 + 0x18))
              (*(undefined8 **)(lVar2 + 0x18),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  kj::
  heap<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,capnp::Response<capnp::AnyPointer>,capnp::Request<capnp::AnyPointer,capnp::AnyPointer>::send()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::Request<capnp::AnyPointer,capnp::AnyPointer>::send()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>
            (&local_20,(anon_class_1_0_00000001_for_func *)&local_58,&local_59);
  plVar1 = local_50;
  *(undefined4 *)&(this->super_Builder).builder.segment = local_20.disposer._0_4_;
  *(undefined4 *)((long)&(this->super_Builder).builder.segment + 4) = local_20.disposer._4_4_;
  *(undefined4 *)&(this->super_Builder).builder.capTable = local_20.ptr._0_4_;
  *(undefined4 *)((long)&(this->super_Builder).builder.capTable + 4) = local_20.ptr._4_4_;
  *(undefined4 *)&(this->super_Builder).builder.pointer = local_48;
  *(undefined4 *)((long)&(this->super_Builder).builder.pointer + 4) = uStack_44;
  *(undefined4 *)&(this->hook).disposer = (undefined4)uStack_40;
  *(undefined4 *)((long)&(this->hook).disposer + 4) = uStack_40._4_4_;
  *(undefined4 *)&(this->hook).ptr = (undefined4)local_38;
  *(undefined4 *)((long)&(this->hook).ptr + 4) = local_38._4_4_;
  *(undefined4 *)&this[1].super_Builder.builder.segment = (undefined4)uStack_30;
  *(undefined4 *)((long)&this[1].super_Builder.builder.segment + 4) = uStack_30._4_4_;
  this[1].super_Builder.builder.capTable = local_28;
  uStack_30 = 0;
  local_38 = 0;
  uStack_40 = 0;
  if (local_50 != (long *)0x0) {
    local_50 = (long *)0x0;
    (**(code **)*local_58)(local_58,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return (ssize_t)this;
}

Assistant:

RemotePromise<Results> Request<Params, Results>::send() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse

  // Convert the Promise to return the correct response type.
  // Explicitly upcast to kj::Promise to make clear that calling .then() doesn't invalidate the
  // Pipeline part of the RemotePromise.
  auto typedPromise = kj::implicitCast<kj::Promise<Response<AnyPointer>>&>(typelessPromise)
      .then([](Response<AnyPointer>&& response) -> Response<Results> {
        return Response<Results>(response.getAs<Results>(), kj::mv(response.hook));
      });

  // Wrap the typeless pipeline in a typed wrapper.
  typename Results::Pipeline typedPipeline(
      kj::mv(kj::implicitCast<AnyPointer::Pipeline&>(typelessPromise)));

  return RemotePromise<Results>(kj::mv(typedPromise), kj::mv(typedPipeline));
}